

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus ZydisNodeHandlerMode(ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZydisMachineMode ZVar1;
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xee8,
                  "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if (index == (ZyanU16 *)0x0) {
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xee9,
                  "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  ZVar1 = instruction->machine_mode;
  if (ZVar1 == ZYDIS_MACHINE_MODE_LONG_64) {
    *index = 2;
    return 0x100000;
  }
  if (ZVar1 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32) {
LAB_00111ed5:
    *index = 1;
  }
  else {
    if (ZVar1 != ZYDIS_MACHINE_MODE_LONG_COMPAT_16) {
      if (ZVar1 == ZYDIS_MACHINE_MODE_LEGACY_32) goto LAB_00111ed5;
      if (ZVar1 != ZYDIS_MACHINE_MODE_LEGACY_16 && ZVar1 != ZYDIS_MACHINE_MODE_MAX_VALUE) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xefa,
                      "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)")
        ;
      }
    }
    *index = 0;
  }
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    switch (instruction->machine_mode)
    {
    case ZYDIS_MACHINE_MODE_LONG_COMPAT_16:
    case ZYDIS_MACHINE_MODE_LEGACY_16:
    case ZYDIS_MACHINE_MODE_REAL_16:
        *index = 0;
        break;
    case ZYDIS_MACHINE_MODE_LONG_COMPAT_32:
    case ZYDIS_MACHINE_MODE_LEGACY_32:
        *index = 1;
        break;
    case ZYDIS_MACHINE_MODE_LONG_64:
        *index = 2;
        break;
    default:
        ZYAN_UNREACHABLE;
    }
    return ZYAN_STATUS_SUCCESS;
}